

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O0

exr_result_t
exr_attr_set_lineorder(exr_context_t ctxt,int part_index,char *name,exr_lineorder_t lval)

{
  int iVar1;
  exr_result_t eVar2;
  uint in_ECX;
  exr_attribute_list_t *in_RDX;
  uint in_ESI;
  _internal_exr_context *in_RDI;
  exr_attribute_list_t *unaff_retaddr;
  exr_context_t in_stack_00000008;
  _internal_exr_part *part;
  _internal_exr_context *pctxt;
  exr_attribute_t **in_stack_00000020;
  exr_result_t rv;
  exr_attribute_t *attr;
  uint8_t val;
  undefined8 in_stack_ffffffffffffffa8;
  int local_34;
  undefined8 in_stack_ffffffffffffffd0;
  exr_attribute_t **out;
  undefined3 in_stack_ffffffffffffffd8;
  undefined4 uVar3;
  undefined1 uVar4;
  undefined4 in_stack_ffffffffffffffe8;
  _internal_exr_context *p_Var5;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  uVar3 = CONCAT13((char)in_ECX,in_stack_ffffffffffffffd8);
  if (in_ECX < 3) {
    if ((in_RDX == (exr_attribute_list_t *)0x0) ||
       (iVar1 = strcmp((char *)in_RDX,"lineOrder"), iVar1 != 0)) {
      out = (exr_attribute_t **)0x0;
      if (in_RDI == (_internal_exr_context *)0x0) {
        local_34 = 2;
      }
      else {
        p_Var5 = in_RDI;
        internal_exr_lock(in_RDI);
        if (((int)in_ESI < 0) || (in_RDI->num_parts <= (int)in_ESI)) {
          internal_exr_unlock(in_RDI);
          local_34 = (*in_RDI->print_error)(in_RDI,4,"Part index (%d) out of range",(ulong)in_ESI);
        }
        else if (in_RDI->mode == '\0') {
          internal_exr_unlock(in_RDI);
          local_34 = (*in_RDI->standard_error)(in_RDI,8);
        }
        else if (in_RDI->mode == '\x03') {
          internal_exr_unlock(in_RDI);
          local_34 = (*in_RDI->standard_error)(in_RDI,0x15);
        }
        else {
          eVar2 = exr_attr_list_find_by_name
                            ((exr_const_context_t)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_RDX,
                             (char *)CONCAT44(in_ECX,uVar3),out);
          uVar4 = (undefined1)((uint)uVar3 >> 0x18);
          if (eVar2 == 0xf) {
            if (in_RDI->mode != '\x01') {
              internal_exr_unlock(in_RDI);
              return 0xf;
            }
            local_34 = exr_attr_list_add(in_stack_00000008,unaff_retaddr,
                                         (char *)CONCAT44(in_stack_fffffffffffffffc,
                                                          in_stack_fffffffffffffff8),
                                         (exr_attribute_type_t)((ulong)p_Var5 >> 0x20),
                                         (int32_t)p_Var5,
                                         (uint8_t **)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                                         in_stack_00000020);
          }
          else {
            if (eVar2 != 0) {
              internal_exr_unlock(in_RDI);
              return eVar2;
            }
            local_34 = 0;
            if (*(int *)((long)out + 0x14) != 0xc) {
              internal_exr_unlock(in_RDI);
              eVar2 = (*in_RDI->print_error)
                                (in_RDI,0x10,
                                 "\'%s\' requested type \'uc\', but stored attributes is type \'%s\'"
                                 ,in_RDX,out[1]);
              return eVar2;
            }
          }
          if (local_34 == 0) {
            *(undefined1 *)(out + 3) = uVar4;
          }
          internal_exr_unlock(in_RDI);
        }
      }
    }
    else {
      local_34 = exr_set_lineorder((exr_context_t)CONCAT44(in_ECX,uVar3),
                                   (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20),
                                   (exr_lineorder_t)in_stack_ffffffffffffffd0);
    }
  }
  else {
    local_34 = (*in_RDI->print_error)
                         (in_RDI,4,"\'%s\' value for line order enum (%d) out of range (%d - %d)",
                          in_RDX,(ulong)in_ECX,0,
                          CONCAT44((int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),3));
  }
  return local_34;
}

Assistant:

exr_result_t
exr_attr_set_lineorder (
    exr_context_t ctxt, int part_index, const char* name, exr_lineorder_t lval)
{
    uint8_t val = (uint8_t) lval;
    if (lval >= EXR_LINEORDER_LAST_TYPE)
        return EXR_CTXT (ctxt)->print_error (
            EXR_CTXT (ctxt),
            EXR_ERR_ARGUMENT_OUT_OF_RANGE,
            "'%s' value for line order enum (%d) out of range (%d - %d)",
            name,
            (int) lval,
            0,
            (int) EXR_LINEORDER_LAST_TYPE);

    if (name && 0 == strcmp (name, EXR_REQ_LO_STR))
        return exr_set_lineorder (ctxt, part_index, lval);

    ATTR_SET_IMPL (EXR_ATTR_LINEORDER, uc);
}